

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt_converter.cpp
# Opt level: O3

uint32_t __thiscall
booster::locale::util::utf8_converter::to_unicode(utf8_converter *this,char **begin,char *end)

{
  code_point cVar1;
  char *p;
  char *local_10;
  
  local_10 = *begin;
  cVar1 = utf::utf_traits<char,1>::decode<char_const*>(&local_10,end);
  if (cVar1 < 0xfffffffe) {
    *begin = local_10;
  }
  return cVar1;
}

Assistant:

virtual uint32_t to_unicode(char const *&begin,char const *end)
        {
            char const *p=begin;
                        
            utf::code_point c = utf::utf_traits<char>::decode(p,end);

            if(c==utf::illegal)
                return illegal;

            if(c==utf::incomplete)
                return incomplete;

            begin = p;
            return c;
        }